

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O0

U32 duckdb_zstd::ZSTD_fracWeight(U32 rawStat)

{
  uint uVar1;
  int in_EDI;
  U32 weight;
  U32 FWeight;
  U32 BWeight;
  U32 hb;
  U32 stat;
  
  uVar1 = ZSTD_highbit32(0);
  return uVar1 * 0x100 + ((uint)((in_EDI + 1) * 0x100) >> ((byte)uVar1 & 0x1f));
}

Assistant:

MEM_STATIC U32 ZSTD_fracWeight(U32 rawStat)
{
    U32 const stat = rawStat + 1;
    U32 const hb = ZSTD_highbit32(stat);
    U32 const BWeight = hb * BITCOST_MULTIPLIER;
    /* Fweight was meant for "Fractional weight"
     * but it's effectively a value between 1 and 2
     * using fixed point arithmetic */
    U32 const FWeight = (stat << BITCOST_ACCURACY) >> hb;
    U32 const weight = BWeight + FWeight;
    assert(hb + BITCOST_ACCURACY < 31);
    return weight;
}